

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void basic_suite::fail_true_comma_true(void)

{
  bool bVar1;
  value vVar2;
  error_code eVar3;
  char input [10];
  reader reader;
  int local_17c;
  view_type local_178;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168,"true,true",10);
  local_178._M_len = strlen(local_168);
  local_178._M_str = local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_178);
  local_17c = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xed,"void basic_suite::fail_true_comma_true()",&local_178,&local_17c);
  vVar2 = trial::protocol::json::basic_reader<char>::symbol(&local_158);
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,vVar2);
  local_17c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xee,"void basic_suite::fail_true_comma_true()",&local_178,&local_17c);
  bVar1 = trial::protocol::json::basic_reader<char>::value<bool>(&local_158);
  local_178._M_len = CONCAT71(local_178._M_len._1_7_,bVar1);
  local_17c._0_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xef,"void basic_suite::fail_true_comma_true()",&local_178,&local_17c);
  local_178._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_178._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[5]>
            ("reader.literal()","\"true\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xf0,"void basic_suite::fail_true_comma_true()",&local_178,"true");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len = CONCAT71(local_178._M_len._1_7_,bVar1);
  local_17c = (uint)local_17c._1_3_ << 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xf1,"void basic_suite::fail_true_comma_true()",&local_178,&local_17c);
  eVar3 = trial::protocol::json::detail::basic_decoder<char>::error(&local_158.decoder);
  local_178._M_str = (char *)eVar3._M_cat;
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,eVar3._M_value);
  local_17c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xf2,"void basic_suite::fail_true_comma_true()",&local_178,&local_17c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fail_true_comma_true()
{
    const char input[] = "true,true";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "true");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
}